

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::deleteHardwareBuffer
          (COpenGL3DriverBase *this,SHWBufferLink *_HWBuffer)

{
  long in_RSI;
  SHWBufferLink *in_RDI;
  CNullDriver *unaff_retaddr;
  SHWBufferLink_opengl *HWBuffer;
  
  if (in_RSI != 0) {
    if (*(int *)(in_RSI + 0x28) != 0) {
      (*GL.DeleteBuffers)(1,(GLuint *)(in_RSI + 0x28));
      *(undefined4 *)(in_RSI + 0x28) = 0;
    }
    if (*(int *)(in_RSI + 0x2c) != 0) {
      (*GL.DeleteBuffers)(1,(GLuint *)(in_RSI + 0x2c));
      *(undefined4 *)(in_RSI + 0x2c) = 0;
    }
    CNullDriver::deleteHardwareBuffer(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void COpenGL3DriverBase::deleteHardwareBuffer(SHWBufferLink *_HWBuffer)
{
	if (!_HWBuffer)
		return;

	SHWBufferLink_opengl *HWBuffer = static_cast<SHWBufferLink_opengl *>(_HWBuffer);
	if (HWBuffer->vbo_verticesID) {
		GL.DeleteBuffers(1, &HWBuffer->vbo_verticesID);
		HWBuffer->vbo_verticesID = 0;
	}
	if (HWBuffer->vbo_indicesID) {
		GL.DeleteBuffers(1, &HWBuffer->vbo_indicesID);
		HWBuffer->vbo_indicesID = 0;
	}

	CNullDriver::deleteHardwareBuffer(_HWBuffer);
}